

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_lc.c
# Opt level: O0

double * MatAdd(double *A,double *B,int row,int col)

{
  double *pdVar1;
  int local_30;
  int local_2c;
  int j;
  int i;
  double *Out;
  int col_local;
  int row_local;
  double *B_local;
  double *A_local;
  
  pdVar1 = (double *)malloc((long)row * 8 * (long)col);
  for (local_2c = 0; local_2c < row; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < col; local_30 = local_30 + 1) {
      pdVar1[col * local_2c + local_30] =
           A[col * local_2c + local_30] + B[col * local_2c + local_30];
    }
  }
  return pdVar1;
}

Assistant:

double *MatAdd(double *A, double *B, int row, int col) {
    double *Out = (double *) malloc(sizeof(double) * row * col);
    for (int i = 0; i < row; i++)
        for (int j = 0; j < col; j++)
            Out[col * i + j] = A[col * i + j] + B[col * i + j];
    return Out;
}